

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestCaseStart(StreamingListener *this,TestCase *test_case)

{
  char *__rhs;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  TestCase *local_18;
  TestCase *test_case_local;
  StreamingListener *this_local;
  
  local_18 = test_case;
  test_case_local = (TestCase *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"event=TestCaseStart&name=",&local_59);
  __rhs = TestCase::name(local_18);
  std::operator+(&local_38,&local_58,__rhs);
  SendLn(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

void OnTestCaseStart(const TestCase& test_case) override {
    SendLn(std::string("event=TestCaseStart&name=") + test_case.name());
  }